

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O2

bool __thiscall
soul::SourceCodeModel::rebuild
          (SourceCodeModel *this,CompileMessageList *errors,
          ArrayView<soul::RefCountedPtr<soul::SourceCodeText>_> filesToLoad)

{
  Comment *this_00;
  string_view firstReplacement;
  pointer ppVar1;
  bool bVar2;
  Namespace *parentNamespace;
  RefCountedPtr<soul::SourceCodeText> *other;
  ulong i;
  char *pcVar3;
  Comment *summary;
  Comment *summary_00;
  ulong uVar4;
  pool_ref<soul::AST::ModuleBase> *m;
  pointer ppVar5;
  File *desc;
  string_view name;
  size_t in_stack_fffffffffffffe48;
  string *psVar6;
  Ptr local_198;
  Ptr local_190;
  CompileMessageList *local_188;
  ArrayView<soul::RefCountedPtr<soul::SourceCodeText>_> filesToLoad_local;
  _Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  local_168;
  CodeLocation local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120 [32];
  string local_100;
  CompileMessageHandler handler;
  CodeLocation local_a0;
  Allocator allocator;
  
  local_188 = errors;
  filesToLoad_local.s = filesToLoad.s;
  filesToLoad_local.e = filesToLoad.e;
  std::vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>::clear
            (&this->files);
  AST::Allocator::Allocator(&allocator);
  parentNamespace = AST::createRootNamespace(&allocator);
  std::vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>::resize
            (&this->files,(long)filesToLoad.e - (long)filesToLoad.s >> 3);
  i = 0;
  while( true ) {
    uVar4 = (long)filesToLoad_local.e - (long)filesToLoad_local.s >> 3;
    if (uVar4 <= i) break;
    other = ArrayView<soul::RefCountedPtr<soul::SourceCodeText>_>::operator[](&filesToLoad_local,i);
    desc = (this->files).
           super__Vector_base<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>
           ._M_impl.super__Vector_impl_data._M_start + i;
    CompileMessageHandler::CompileMessageHandler(&handler,local_188);
    local_190.object = other->object;
    if (local_190.object != (SourceCodeText *)0x0) {
      ((local_190.object)->super_RefCountedObject).refCount =
           ((local_190.object)->super_RefCountedObject).refCount + 1;
    }
    CodeLocation::CodeLocation(&local_a0,&local_190);
    Compiler::parseTopLevelDeclarations
              ((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                *)&local_168,&allocator,&local_a0,parentNamespace);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_a0.sourceCode);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_190);
    ppVar1 = local_168._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar5 = local_168._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar1;
        ppVar5 = ppVar5 + 1) {
      ASTUtilities::mergeDuplicateNamespaces(parentNamespace);
      recurseFindingModules(ppVar5->object,desc,&allocator.stringDictionary);
    }
    std::
    _Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
    ::~_Vector_base(&local_168);
    CompileMessageHandler::~CompileMessageHandler(&handler);
    bVar2 = CompileMessageList::hasErrors(local_188);
    if (bVar2) break;
    RefCountedPtr<soul::SourceCodeText>::operator=(&desc->source,other);
    RefCountedPtr<soul::SourceCodeText>::operator->(other);
    psVar6 = &desc->filename;
    std::__cxx11::string::_M_assign((string *)psVar6);
    std::__cxx11::string::string(local_120,(string *)psVar6);
    firstReplacement._M_str = (char *)psVar6;
    firstReplacement._M_len = in_stack_fffffffffffffe48;
    pcVar3 = ".soul";
    choc::text::replace<std::__cxx11::string>
              (&local_100,(text *)local_120,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5,
               (string_view)ZEXT816(0x27548a),firstReplacement);
    std::operator+(&local_140,"lib_",&local_100);
    name._M_str = pcVar3;
    name._M_len = (size_t)local_140._M_dataplus._M_p;
    makeUID_abi_cxx11_((string *)&handler,(soul *)local_140._M_string_length,name);
    std::__cxx11::string::operator=((string *)&desc->UID,(string *)&handler);
    std::__cxx11::string::~string((string *)&handler);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string(local_120);
    local_198.object = other->object;
    if (local_198.object != (SourceCodeText *)0x0) {
      ((local_198.object)->super_RefCountedObject).refCount =
           ((local_198.object)->super_RefCountedObject).refCount + 1;
    }
    CodeLocation::CodeLocation(&local_150,&local_198);
    SourceCodeUtilities::getFileSummaryComment((Comment *)&handler,&local_150);
    this_00 = &desc->fileComment;
    SourceCodeUtilities::Comment::operator=(this_00,(Comment *)&handler);
    SourceCodeUtilities::Comment::~Comment((Comment *)&handler);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_150.sourceCode);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_198);
    SourceCodeUtilities::getFileSummaryTitle_abi_cxx11_
              ((string *)&handler,(SourceCodeUtilities *)this_00,summary);
    std::__cxx11::string::operator=((string *)&desc->title,(string *)&handler);
    std::__cxx11::string::~string((string *)&handler);
    SourceCodeUtilities::getFileSummaryBody_abi_cxx11_
              ((string *)&handler,(SourceCodeUtilities *)this_00,summary_00);
    std::__cxx11::string::operator=((string *)&desc->summary,(string *)&handler);
    std::__cxx11::string::~string((string *)&handler);
    if ((desc->title)._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&desc->title);
    }
    i = i + 1;
  }
  AST::Allocator::~Allocator(&allocator);
  return uVar4 <= i;
}

Assistant:

bool SourceCodeModel::rebuild (CompileMessageList& errors, ArrayView<SourceCodeText::Ptr> filesToLoad)
{
    files.clear();
    AST::Allocator allocator;
    auto& topLevelNamespace = AST::createRootNamespace (allocator);

    files.resize (filesToLoad.size());

    for (size_t i = 0; i < filesToLoad.size(); ++i)
    {
        auto& f = filesToLoad[i];
        auto& desc = files[i];

        try
        {
            CompileMessageHandler handler (errors);

            for (auto& m : Compiler::parseTopLevelDeclarations (allocator, f, topLevelNamespace))
            {
                ASTUtilities::mergeDuplicateNamespaces (topLevelNamespace);
                recurseFindingModules (m, desc, allocator.stringDictionary);
            }
        }
        catch (AbortCompilationException) {}

        if (errors.hasErrors())
            return false;

        desc.source = f;
        desc.filename = f->filename;
        desc.UID = makeUID ("lib_" + choc::text::replace (desc.filename, ".soul", ""));
        desc.fileComment = SourceCodeUtilities::getFileSummaryComment (f);
        desc.title = SourceCodeUtilities::getFileSummaryTitle (desc.fileComment);
        desc.summary = SourceCodeUtilities::getFileSummaryBody (desc.fileComment);

        if (desc.title.empty())
            desc.title = desc.filename;
    }

    return true;
}